

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O3

char * amqp_constant_name(int constantNumber)

{
  if (constantNumber < 0x1f5) {
    if (constantNumber < 0x137) {
      switch(constantNumber) {
      case 1:
        return "AMQP_FRAME_METHOD";
      case 2:
        return "AMQP_FRAME_HEADER";
      case 3:
        return "AMQP_FRAME_BODY";
      case 4:
      case 5:
      case 6:
      case 7:
        break;
      case 8:
        return "AMQP_FRAME_HEARTBEAT";
      default:
        if (constantNumber == 200) {
          return "AMQP_REPLY_SUCCESS";
        }
        if (constantNumber == 0xce) {
          return "AMQP_FRAME_END";
        }
      }
    }
    else {
      switch(constantNumber) {
      case 0x192:
        return "AMQP_INVALID_PATH";
      case 0x193:
        return "AMQP_ACCESS_REFUSED";
      case 0x194:
        return "AMQP_NOT_FOUND";
      case 0x195:
        return "AMQP_RESOURCE_LOCKED";
      case 0x196:
        return "AMQP_PRECONDITION_FAILED";
      }
      switch(constantNumber) {
      case 0x137:
        return "AMQP_CONTENT_TOO_LARGE";
      case 0x138:
        return "AMQP_NO_ROUTE";
      case 0x139:
        return "AMQP_NO_CONSUMERS";
      case 0x140:
        return "AMQP_CONNECTION_FORCED";
      }
    }
  }
  else if (constantNumber < 0x212) {
    switch(constantNumber) {
    case 0x1f5:
      return "AMQP_FRAME_ERROR";
    case 0x1f6:
      return "AMQP_SYNTAX_ERROR";
    case 0x1f7:
      return "AMQP_COMMAND_INVALID";
    case 0x1f8:
      return "AMQP_CHANNEL_ERROR";
    case 0x1f9:
      return "AMQP_UNEXPECTED_FRAME";
    case 0x1fa:
      return "AMQP_RESOURCE_ERROR";
    }
  }
  else if (constantNumber < 0x21d) {
    if (constantNumber == 0x212) {
      return "AMQP_NOT_ALLOWED";
    }
    if (constantNumber == 0x21c) {
      return "AMQP_NOT_IMPLEMENTED";
    }
  }
  else {
    if (constantNumber == 0x21d) {
      return "AMQP_INTERNAL_ERROR";
    }
    if (constantNumber == 0x1000) {
      return "AMQP_FRAME_MIN_SIZE";
    }
  }
  return "(unknown)";
}

Assistant:

char const *amqp_constant_name(int constantNumber) {
  switch (constantNumber) {
    case AMQP_FRAME_METHOD:
      return "AMQP_FRAME_METHOD";
    case AMQP_FRAME_HEADER:
      return "AMQP_FRAME_HEADER";
    case AMQP_FRAME_BODY:
      return "AMQP_FRAME_BODY";
    case AMQP_FRAME_HEARTBEAT:
      return "AMQP_FRAME_HEARTBEAT";
    case AMQP_FRAME_MIN_SIZE:
      return "AMQP_FRAME_MIN_SIZE";
    case AMQP_FRAME_END:
      return "AMQP_FRAME_END";
    case AMQP_REPLY_SUCCESS:
      return "AMQP_REPLY_SUCCESS";
    case AMQP_CONTENT_TOO_LARGE:
      return "AMQP_CONTENT_TOO_LARGE";
    case AMQP_NO_ROUTE:
      return "AMQP_NO_ROUTE";
    case AMQP_NO_CONSUMERS:
      return "AMQP_NO_CONSUMERS";
    case AMQP_ACCESS_REFUSED:
      return "AMQP_ACCESS_REFUSED";
    case AMQP_NOT_FOUND:
      return "AMQP_NOT_FOUND";
    case AMQP_RESOURCE_LOCKED:
      return "AMQP_RESOURCE_LOCKED";
    case AMQP_PRECONDITION_FAILED:
      return "AMQP_PRECONDITION_FAILED";
    case AMQP_CONNECTION_FORCED:
      return "AMQP_CONNECTION_FORCED";
    case AMQP_INVALID_PATH:
      return "AMQP_INVALID_PATH";
    case AMQP_FRAME_ERROR:
      return "AMQP_FRAME_ERROR";
    case AMQP_SYNTAX_ERROR:
      return "AMQP_SYNTAX_ERROR";
    case AMQP_COMMAND_INVALID:
      return "AMQP_COMMAND_INVALID";
    case AMQP_CHANNEL_ERROR:
      return "AMQP_CHANNEL_ERROR";
    case AMQP_UNEXPECTED_FRAME:
      return "AMQP_UNEXPECTED_FRAME";
    case AMQP_RESOURCE_ERROR:
      return "AMQP_RESOURCE_ERROR";
    case AMQP_NOT_ALLOWED:
      return "AMQP_NOT_ALLOWED";
    case AMQP_NOT_IMPLEMENTED:
      return "AMQP_NOT_IMPLEMENTED";
    case AMQP_INTERNAL_ERROR:
      return "AMQP_INTERNAL_ERROR";
    default:
      return "(unknown)";
  }
}